

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 ExtractNonSpaceToken(char **pzIn,char *zEnd,SyString *pOut)

{
  char *pcVar1;
  char cVar2;
  ushort **ppuVar3;
  char *pcVar4;
  long lVar5;
  
  pcVar4 = *pzIn;
  while( true ) {
    if (zEnd <= pcVar4) {
      return -0x12;
    }
    cVar2 = *pcVar4;
    if ((0xffffffffffffffbf < (ulong)(long)cVar2) ||
       (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (long)cVar2 * 2 + 1) & 0x20) == 0))
    break;
    pcVar4 = pcVar4 + 1;
  }
  lVar5 = 0;
  while (((pcVar1 = pcVar4 + lVar5, pcVar1 < zEnd &&
          (cVar2 = *pcVar1, (ulong)(long)cVar2 < 0xffffffffffffffc0)) &&
         (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (long)cVar2 * 2 + 1) & 0x20) == 0))
        ) {
    lVar5 = lVar5 + 1;
  }
  pOut->zString = pcVar4;
  pOut->nByte = (uint)lVar5;
  *pzIn = pcVar1;
  return 0;
}

Assistant:

static sxi32 ExtractNonSpaceToken(const char **pzIn, const char *zEnd, SyString *pOut)
{
	const char *zIn = *pzIn;
	const char *zPtr;
	/* Ignore leading white spaces */
	while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && SyisSpace(zIn[0]) ){
		zIn++;
	}
	if( zIn >= zEnd ){
		/* End of input */
		return SXERR_EOF;
	}
	zPtr = zIn;
	/* Extract the token */
	while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && !SyisSpace(zIn[0]) ){
		zIn++;
	}
	SyStringInitFromBuf(pOut, zPtr, zIn-zPtr);
	/* Synchronize pointers */
	*pzIn = zIn;
	/* Return to the caller */
	return SXRET_OK;
}